

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  float *pfVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float **ppfVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  float *pfVar20;
  double *pdVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  if (0 < count) {
    iVar4 = this->kStateCount;
    iVar5 = this->kCategoryCount;
    ppfVar7 = this->gTransitionMatrices;
    auVar24 = vpbroadcastq_avx512f();
    uVar22 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (0 < iVar5) {
        pfVar20 = ppfVar7[matrixIndices[uVar22]];
        pdVar21 = inMatrices + iVar4 * iVar4 * iVar5 * (int)uVar22;
        iVar6 = this->kTransPaddedStateCount;
        iVar19 = 0;
        do {
          if (0 < iVar4) {
            dVar3 = paddedValues[uVar22];
            iVar17 = 0;
            do {
              uVar18 = 0;
              do {
                auVar26 = vpbroadcastq_avx512f();
                auVar26 = vporq_avx512f(auVar26,auVar25);
                uVar16 = vpcmpuq_avx512f(auVar26,auVar24,2);
                pdVar2 = pdVar21 + uVar18;
                auVar26._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar2[1];
                auVar26._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar2;
                auVar26._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar2[2];
                auVar26._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar2[3];
                auVar26._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar2[4];
                auVar26._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar2[5];
                auVar26._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar2[6];
                auVar26._56_8_ = (uVar16 >> 7) * (long)pdVar2[7];
                auVar23 = vcvtpd2ps_avx512f(auVar26);
                pfVar1 = pfVar20 + uVar18;
                bVar8 = (bool)((byte)uVar16 & 1);
                bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar16 >> 2) & 1);
                bVar11 = (bool)((byte)(uVar16 >> 3) & 1);
                bVar12 = (bool)((byte)(uVar16 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
                bVar15 = SUB81(uVar16 >> 7,0);
                *pfVar1 = (float)((uint)bVar8 * auVar23._0_4_ | (uint)!bVar8 * (int)*pfVar1);
                pfVar1[1] = (float)((uint)bVar9 * auVar23._4_4_ | (uint)!bVar9 * (int)pfVar1[1]);
                pfVar1[2] = (float)((uint)bVar10 * auVar23._8_4_ | (uint)!bVar10 * (int)pfVar1[2]);
                pfVar1[3] = (float)((uint)bVar11 * auVar23._12_4_ | (uint)!bVar11 * (int)pfVar1[3]);
                pfVar1[4] = (float)((uint)bVar12 * auVar23._16_4_ | (uint)!bVar12 * (int)pfVar1[4]);
                pfVar1[5] = (float)((uint)bVar13 * auVar23._20_4_ | (uint)!bVar13 * (int)pfVar1[5]);
                pfVar1[6] = (float)((uint)bVar14 * auVar23._24_4_ | (uint)!bVar14 * (int)pfVar1[6]);
                pfVar1[7] = (float)((uint)bVar15 * auVar23._28_4_ | (uint)!bVar15 * (int)pfVar1[7]);
                uVar18 = uVar18 + 8;
              } while ((iVar4 + 7U & 0xfffffff8) != uVar18);
              pfVar20[iVar4] = (float)dVar3;
              pfVar20 = pfVar20 + iVar6;
              pdVar21 = pdVar21 + iVar4;
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar4);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar5);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uint)count);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}